

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::
     __move_merge_adaptive_backward<QList<QGraphicsItem*>::iterator,QGraphicsItem**,QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (ulong *__first1,ulong *__last1,QGraphicsItem **__first2,QGraphicsItem **__last2,
               iterator __result)

{
  if (__first1 != __last1) {
    if (__first2 == __last2) {
      return;
    }
    __last2 = __last2 + -1;
    do {
      __last1 = __last1 + -1;
      while( true ) {
        __result.i = __result.i + -1;
        if (*__last2 < (QGraphicsItem *)*__last1) break;
        *__result.i = *__last2;
        if (__last2 == __first2) {
          return;
        }
        __last2 = __last2 + -1;
      }
      *__result.i = (QGraphicsItem *)*__last1;
    } while (__last1 != __first1);
    __last2 = __last2 + 1;
  }
  __copy_move_backward<true,false,std::random_access_iterator_tag>::
  __copy_move_b<QGraphicsItem**,QList<QGraphicsItem*>::iterator>(__first2,__last2,__result);
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }